

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalStorage::ChangeType
          (LocalStorage *this,DataTable *old_dt,DataTable *new_dt,idx_t changed_idx,
          LogicalType *target_type,vector<duckdb::StorageIndex,_true> *bound_columns,
          Expression *cast_expr)

{
  ClientContext *args_1;
  type args_3;
  shared_ptr<duckdb::LocalTableStorage,_true> storage;
  idx_t changed_idx_local;
  shared_ptr<duckdb::LocalTableStorage,_true> local_58;
  shared_ptr<duckdb::LocalTableStorage,_true> new_storage;
  
  changed_idx_local = changed_idx;
  LocalTableManager::MoveEntry((LocalTableManager *)&storage,(DataTable *)&this->table_manager);
  if (storage.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    args_1 = this->context;
    args_3 = shared_ptr<duckdb::LocalTableStorage,_true>::operator*(&storage);
    make_shared_ptr<duckdb::LocalTableStorage,duckdb::ClientContext&,duckdb::DataTable&,duckdb::LocalTableStorage&,unsigned_long&,duckdb::LogicalType_const&,duckdb::vector<duckdb::StorageIndex,true>const&,duckdb::Expression&>
              ((ClientContext *)&new_storage,(DataTable *)args_1,(LocalTableStorage *)new_dt,
               (unsigned_long *)args_3,(LogicalType *)&changed_idx_local,
               (vector<duckdb::StorageIndex,_true> *)target_type,(Expression *)bound_columns);
    local_58.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = new_storage.internal.
             super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         new_storage.internal.
         super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    new_storage.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    new_storage.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    LocalTableManager::InsertEntry(&this->table_manager,new_dt,&local_58);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.internal.
                super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_storage.internal.
                super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&storage.internal.
              super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void LocalStorage::ChangeType(DataTable &old_dt, DataTable &new_dt, idx_t changed_idx, const LogicalType &target_type,
                              const vector<StorageIndex> &bound_columns, Expression &cast_expr) {
	// check if there are any pending appends for the old version of the table
	auto storage = table_manager.MoveEntry(old_dt);
	if (!storage) {
		return;
	}
	auto new_storage = make_shared_ptr<LocalTableStorage>(context, new_dt, *storage, changed_idx, target_type,
	                                                      bound_columns, cast_expr);
	table_manager.InsertEntry(new_dt, std::move(new_storage));
}